

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t * Catch::ConsoleReporter::findMax(size_t *i,size_t *j,size_t *k)

{
  size_t *k_local;
  size_t *j_local;
  size_t *i_local;
  
  if (((*i <= *j) || (i_local = i, *i <= *k)) && (i_local = k, *k < *j)) {
    i_local = j;
  }
  return i_local;
}

Assistant:

static std::size_t& findMax( std::size_t& i, std::size_t& j, std::size_t& k ) {
            if( i > j && i > k )
                return i;
            else if( j > k )
                return j;
            else
                return k;
        }